

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

ssize_t read(int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  ssize_t sVar2;
  ulong uVar3;
  ssize_t extraout_RAX;
  allocator local_61;
  string local_60 [36];
  int local_3c;
  char *pcStack_38;
  int length;
  char *buffer_msg;
  size_t msg_size;
  char buffer_header [8];
  int valread;
  string *msg_local;
  int new_socket_local;
  
  unique0x1000013c = (string *)__buf;
  memset((void *)((long)&msg_size + 4),0,8);
  sVar2 = read(__fd,(void *)((long)&msg_size + 4),8);
  buffer_header._0_4_ = (undefined4)sVar2;
  buffer_msg = stack0xffffffffffffffdc;
  pcStack_38 = (char *)malloc((size_t)stack0xffffffffffffffdc);
  memset(pcStack_38,0,(size_t)buffer_msg);
  local_3c = 0;
  for (; pcVar1 = pcStack_38, buffer_msg != (char *)0x0;
      buffer_msg = buffer_msg + -(long)(int)buffer_header._0_4_) {
    sVar2 = read(__fd,pcStack_38 + local_3c,(size_t)buffer_msg);
    buffer_header._0_4_ = (undefined4)sVar2;
    local_3c = buffer_header._0_4_ + local_3c;
  }
  uVar3 = (ulong)local_3c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,pcVar1,uVar3,&local_61);
  std::__cxx11::string::operator=(stack0xffffffffffffffe8,local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  free(pcStack_38);
  return extraout_RAX;
}

Assistant:

void read(int new_socket, string& msg) {
	int valread;
	char buffer_header[sizeof(size_t)] = {0}; 
	valread = read( new_socket , buffer_header, sizeof(size_t));

	size_t msg_size;
	memcpy(&msg_size, buffer_header, sizeof(size_t));

	char* buffer_msg = (char*)malloc(msg_size*sizeof(char));
	memset(buffer_msg, '\0', sizeof(char)*msg_size);
	int length = 0;
	for(length = 0; msg_size != 0; length += valread) {
		valread = read( new_socket , buffer_msg+length, msg_size);
		msg_size -= valread;
	}

	msg = std::string(buffer_msg, length);
	free(buffer_msg);
}